

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

int __thiscall
JsUtil::
List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
::SetAtFirstFreeSpot
          (List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
           *this,RecyclerWeakReference<Js::ScriptFunctionType> **item)

{
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_> *addr;
  RecyclerWeakReference<Js::ScriptFunctionType> *pRVar1;
  int iVar2;
  
  iVar2 = Js::
          WeakRefFreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
          ::GetFreeItemIndex(&this->removePolicy,this);
  if (iVar2 != -1) {
    pRVar1 = *item;
    addr = (this->
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
           ).buffer.ptr + iVar2;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pRVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    return iVar2;
  }
  iVar2 = Add(this,item);
  return iVar2;
}

Assistant:

int SetAtFirstFreeSpot(const T& item)
        {
            int indexToSetAt = removePolicy.GetFreeItemIndex(this);

            if (indexToSetAt == -1)
            {
                return Add(item);
            }

            this->buffer[indexToSetAt] = item;
            return indexToSetAt;
        }